

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

DenseSetPair<unsigned_short> * __thiscall
llvm::
DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
::InsertIntoBucketImpl<unsigned_short>
          (DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
           *this,unsigned_short *Key,unsigned_short *Lookup,DenseSetPair<unsigned_short> *TheBucket)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  unsigned_short *LHS;
  unsigned_short local_32;
  uint local_30;
  int iStack_2c;
  unsigned_short EmptyKey;
  uint NumBuckets;
  uint NewNumEntries;
  DenseSetPair<unsigned_short> *TheBucket_local;
  unsigned_short *Lookup_local;
  unsigned_short *Key_local;
  DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
  *this_local;
  
  _NumBuckets = TheBucket;
  TheBucket_local = (DenseSetPair<unsigned_short> *)Lookup;
  Lookup_local = Key;
  Key_local = (unsigned_short *)this;
  DebugEpochBase::incrementEpoch((DebugEpochBase *)this);
  uVar3 = getNumEntries(this);
  iStack_2c = uVar3 + 1;
  uVar3 = getNumBuckets(this);
  iVar1 = iStack_2c;
  local_30 = uVar3;
  if ((uint)(iStack_2c << 2) < uVar3 * 3) {
    uVar4 = getNumTombstones(this);
    if (uVar3 - (iVar1 + uVar4) <= local_30 >> 3) {
      grow(this,local_30);
      LookupBucketFor<unsigned_short>
                (this,&TheBucket_local->key,(DenseSetPair<unsigned_short> **)&NumBuckets);
    }
  }
  else {
    grow(this,uVar3 << 1);
    LookupBucketFor<unsigned_short>
              (this,&TheBucket_local->key,(DenseSetPair<unsigned_short> **)&NumBuckets);
    local_30 = getNumBuckets(this);
  }
  if (_NumBuckets == (DenseSetPair<unsigned_short> *)0x0) {
    __assert_fail("TheBucket",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                  ,0x22f,
                  "BucketT *llvm::DenseMapBase<llvm::SmallDenseMap<unsigned short, llvm::detail::DenseSetEmpty, 4, llvm::DenseMapInfo<unsigned short>, llvm::detail::DenseSetPair<unsigned short>>, unsigned short, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<unsigned short>, llvm::detail::DenseSetPair<unsigned short>>::InsertIntoBucketImpl(const KeyT &, const LookupKeyT &, BucketT *) [DerivedT = llvm::SmallDenseMap<unsigned short, llvm::detail::DenseSetEmpty, 4, llvm::DenseMapInfo<unsigned short>, llvm::detail::DenseSetPair<unsigned short>>, KeyT = unsigned short, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DenseMapInfo<unsigned short>, BucketT = llvm::detail::DenseSetPair<unsigned short>, LookupKeyT = unsigned short]"
                 );
  }
  incrementNumEntries(this);
  local_32 = getEmptyKey();
  LHS = detail::DenseSetPair<unsigned_short>::getFirst(_NumBuckets);
  bVar2 = DenseMapInfo<unsigned_short>::isEqual(LHS,&local_32);
  if (!bVar2) {
    decrementNumTombstones(this);
  }
  return _NumBuckets;
}

Assistant:

BucketT *InsertIntoBucketImpl(const KeyT &Key, const LookupKeyT &Lookup,
                                BucketT *TheBucket) {
    incrementEpoch();

    // If the load of the hash table is more than 3/4, or if fewer than 1/8 of
    // the buckets are empty (meaning that many are filled with tombstones),
    // grow the table.
    //
    // The later case is tricky.  For example, if we had one empty bucket with
    // tons of tombstones, failing lookups (e.g. for insertion) would have to
    // probe almost the entire table until it found the empty bucket.  If the
    // table completely filled with tombstones, no lookup would ever succeed,
    // causing infinite loops in lookup.
    unsigned NewNumEntries = getNumEntries() + 1;
    unsigned NumBuckets = getNumBuckets();
    if (LLVM_UNLIKELY(NewNumEntries * 4 >= NumBuckets * 3)) {
      this->grow(NumBuckets * 2);
      LookupBucketFor(Lookup, TheBucket);
      NumBuckets = getNumBuckets();
    } else if (LLVM_UNLIKELY(NumBuckets-(NewNumEntries+getNumTombstones()) <=
                             NumBuckets/8)) {
      this->grow(NumBuckets);
      LookupBucketFor(Lookup, TheBucket);
    }
    assert(TheBucket);

    // Only update the state after we've grown our bucket space appropriately
    // so that when growing buckets we have self-consistent entry count.
    incrementNumEntries();

    // If we are writing over a tombstone, remember this.
    const KeyT EmptyKey = getEmptyKey();
    if (!KeyInfoT::isEqual(TheBucket->getFirst(), EmptyKey))
      decrementNumTombstones();

    return TheBucket;
  }